

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configManager.cpp
# Opt level: O0

void ConfigManager::storeFilter(ofstream *out,FilterSlicer *filter)

{
  size_type sVar1;
  reference pvVar2;
  double local_30;
  double y;
  double x;
  int i;
  uint32_t n;
  FilterSlicer *filter_local;
  ofstream *out_local;
  
  _i = filter;
  filter_local = (FilterSlicer *)out;
  sVar1 = std::vector<Geometry::Point,_std::allocator<Geometry::Point>_>::size(&filter->poly);
  x._4_4_ = (uint)sVar1;
  std::ostream::write((char *)filter_local,(long)&x + 4);
  for (x._0_4_ = 0; x._0_4_ < x._4_4_; x._0_4_ = x._0_4_ + 1) {
    pvVar2 = std::vector<Geometry::Point,_std::allocator<Geometry::Point>_>::operator[]
                       (&_i->poly,(long)(int)x._0_4_);
    y = pvVar2->x;
    pvVar2 = std::vector<Geometry::Point,_std::allocator<Geometry::Point>_>::operator[]
                       (&_i->poly,(long)(int)x._0_4_);
    local_30 = pvVar2->y;
    std::ostream::write((char *)filter_local,(long)&y);
    std::ostream::write((char *)filter_local,(long)&local_30);
  }
  return;
}

Assistant:

void ConfigManager::storeFilter(std::ofstream &out, FilterSlicer* filter) {
	uint32_t n = filter->poly.size();
	out.write((char*)&n, sizeof(n));
	for(int i=0;i<n;++i)
	{
		double x,y;
		x = filter->poly[i].x;
		y = filter->poly[i].y;
		out.write((char*)&x, sizeof(x));
		out.write((char*)&y, sizeof(y));
	}
}